

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

void xmlSchemaFreeValidCtxt(xmlSchemaValidCtxtPtr ctxt)

{
  xmlSchemaPSVIIDCNodePtr pxVar1;
  xmlSchemaIDCAugPtr pxVar2;
  xmlSchemaNodeInfoPtr ielem;
  xmlSchemaNodeInfoPtr ei;
  int i_3;
  xmlSchemaAttrInfoPtr attr;
  int i_2;
  xmlSchemaIDCAugPtr_conflict next;
  xmlSchemaIDCAugPtr_conflict cur;
  int i_1;
  xmlSchemaPSVIIDCNodePtr item;
  int i;
  xmlSchemaValidCtxtPtr ctxt_local;
  
  if (ctxt != (xmlSchemaValidCtxtPtr)0x0) {
    if (ctxt->value != (xmlSchemaValPtr)0x0) {
      xmlSchemaFreeValue(ctxt->value);
    }
    if (ctxt->pctxt != (xmlSchemaParserCtxtPtr)0x0) {
      xmlSchemaFreeParserCtxt(ctxt->pctxt);
    }
    if (ctxt->idcNodes != (xmlSchemaPSVIIDCNodePtr *)0x0) {
      for (item._4_4_ = 0; item._4_4_ < ctxt->nbIdcNodes; item._4_4_ = item._4_4_ + 1) {
        pxVar1 = ctxt->idcNodes[item._4_4_];
        (*xmlFree)(pxVar1->keys);
        (*xmlFree)(pxVar1);
      }
      (*xmlFree)(ctxt->idcNodes);
    }
    if (ctxt->idcKeys != (xmlSchemaPSVIIDCKeyPtr *)0x0) {
      for (cur._4_4_ = 0; cur._4_4_ < ctxt->nbIdcKeys; cur._4_4_ = cur._4_4_ + 1) {
        xmlSchemaIDCFreeKey(ctxt->idcKeys[cur._4_4_]);
      }
      (*xmlFree)(ctxt->idcKeys);
    }
    if (ctxt->xpathStates != (xmlSchemaIDCStateObjPtr_conflict)0x0) {
      xmlSchemaFreeIDCStateObjList(ctxt->xpathStates);
      ctxt->xpathStates = (xmlSchemaIDCStateObjPtr_conflict)0x0;
    }
    if (ctxt->xpathStatePool != (xmlSchemaIDCStateObjPtr_conflict)0x0) {
      xmlSchemaFreeIDCStateObjList(ctxt->xpathStatePool);
      ctxt->xpathStatePool = (xmlSchemaIDCStateObjPtr_conflict)0x0;
    }
    if (ctxt->aidcs != (xmlSchemaIDCAugPtr_conflict)0x0) {
      next = ctxt->aidcs;
      do {
        pxVar2 = next->next;
        (*xmlFree)(next);
        next = pxVar2;
      } while (pxVar2 != (xmlSchemaIDCAugPtr)0x0);
    }
    if (ctxt->attrInfos != (xmlSchemaAttrInfoPtr *)0x0) {
      if (ctxt->nbAttrInfos != 0) {
        xmlSchemaClearAttrInfos(ctxt);
      }
      for (attr._4_4_ = 0; attr._4_4_ < ctxt->sizeAttrInfos; attr._4_4_ = attr._4_4_ + 1) {
        (*xmlFree)(ctxt->attrInfos[attr._4_4_]);
      }
      (*xmlFree)(ctxt->attrInfos);
    }
    if (ctxt->elemInfos != (xmlSchemaNodeInfoPtr *)0x0) {
      for (ei._4_4_ = 0;
          (ei._4_4_ < ctxt->sizeElemInfos &&
          (ielem = ctxt->elemInfos[ei._4_4_], ielem != (xmlSchemaNodeInfoPtr)0x0));
          ei._4_4_ = ei._4_4_ + 1) {
        xmlSchemaClearElemInfo(ctxt,ielem);
        (*xmlFree)(ielem);
      }
      (*xmlFree)(ctxt->elemInfos);
    }
    if (ctxt->nodeQNames != (xmlSchemaItemListPtr)0x0) {
      xmlSchemaItemListFree(ctxt->nodeQNames);
    }
    if (ctxt->dict != (xmlDictPtr)0x0) {
      xmlDictFree(ctxt->dict);
    }
    if (ctxt->filename != (char *)0x0) {
      (*xmlFree)(ctxt->filename);
    }
    (*xmlFree)(ctxt);
  }
  return;
}

Assistant:

void
xmlSchemaFreeValidCtxt(xmlSchemaValidCtxtPtr ctxt)
{
    if (ctxt == NULL)
        return;
    if (ctxt->value != NULL)
        xmlSchemaFreeValue(ctxt->value);
    if (ctxt->pctxt != NULL)
	xmlSchemaFreeParserCtxt(ctxt->pctxt);
    if (ctxt->idcNodes != NULL) {
	int i;
	xmlSchemaPSVIIDCNodePtr item;

	for (i = 0; i < ctxt->nbIdcNodes; i++) {
	    item = ctxt->idcNodes[i];
	    xmlFree(item->keys);
	    xmlFree(item);
	}
	xmlFree(ctxt->idcNodes);
    }
    if (ctxt->idcKeys != NULL) {
	int i;
	for (i = 0; i < ctxt->nbIdcKeys; i++)
	    xmlSchemaIDCFreeKey(ctxt->idcKeys[i]);
	xmlFree(ctxt->idcKeys);
    }

    if (ctxt->xpathStates != NULL) {
	xmlSchemaFreeIDCStateObjList(ctxt->xpathStates);
	ctxt->xpathStates = NULL;
    }
    if (ctxt->xpathStatePool != NULL) {
	xmlSchemaFreeIDCStateObjList(ctxt->xpathStatePool);
	ctxt->xpathStatePool = NULL;
    }

    /*
    * Augmented IDC information.
    */
    if (ctxt->aidcs != NULL) {
	xmlSchemaIDCAugPtr cur = ctxt->aidcs, next;
	do {
	    next = cur->next;
	    xmlFree(cur);
	    cur = next;
	} while (cur != NULL);
    }
    if (ctxt->attrInfos != NULL) {
	int i;
	xmlSchemaAttrInfoPtr attr;

	/* Just a paranoid call to the cleanup. */
	if (ctxt->nbAttrInfos != 0)
	    xmlSchemaClearAttrInfos(ctxt);
	for (i = 0; i < ctxt->sizeAttrInfos; i++) {
	    attr = ctxt->attrInfos[i];
	    xmlFree(attr);
	}
	xmlFree(ctxt->attrInfos);
    }
    if (ctxt->elemInfos != NULL) {
	int i;
	xmlSchemaNodeInfoPtr ei;

	for (i = 0; i < ctxt->sizeElemInfos; i++) {
	    ei = ctxt->elemInfos[i];
	    if (ei == NULL)
		break;
	    xmlSchemaClearElemInfo(ctxt, ei);
	    xmlFree(ei);
	}
	xmlFree(ctxt->elemInfos);
    }
    if (ctxt->nodeQNames != NULL)
	xmlSchemaItemListFree(ctxt->nodeQNames);
    if (ctxt->dict != NULL)
	xmlDictFree(ctxt->dict);
    if (ctxt->filename != NULL)
	xmlFree(ctxt->filename);
    xmlFree(ctxt);
}